

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O0

void __thiscall
StringType::DoGenParseCode(StringType *this,Output *out_cc,Env *env,DataPtr *data,int flags)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  ID *pIVar5;
  Output *in_RSI;
  Type *in_RDI;
  int len;
  string str_size;
  Type *in_stack_fffffffffffffee8;
  Env *in_stack_fffffffffffffef0;
  int *in_stack_fffffffffffffef8;
  Output *pOVar6;
  Env *in_stack_ffffffffffffff00;
  Expr *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  Object *in_stack_ffffffffffffff18;
  allocator<char> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  DataPtr *in_stack_ffffffffffffff30;
  Env *in_stack_ffffffffffffff38;
  Output *in_stack_ffffffffffffff40;
  StringType *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  undefined2 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  Output *in_stack_ffffffffffffff88;
  StringType *in_stack_ffffffffffffff90;
  int local_58;
  string local_48 [48];
  
  GenStringSize_abi_cxx11_
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30);
  if (*(int *)&in_RDI->field_0x18c == 0) {
    GenCheckingCStr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                    (Env *)((ulong)CONCAT13(in_stack_ffffffffffffff87,
                                            CONCAT12(in_stack_ffffffffffffff86,
                                                     in_stack_ffffffffffffff84)) << 0x20),
                    (DataPtr *)in_RDI,
                    (string *)
                    CONCAT17(in_stack_ffffffffffffff77,
                             CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)));
  }
  bVar1 = Type::anonymous_value_var(in_RDI);
  pOVar6 = in_RSI;
  if (!bVar1) {
    if (((*(int *)&in_RDI->field_0x18c == 2) && (in_RDI->attr_length_expr_ != (Expr *)0x0)) &&
       (bVar1 = Expr::ConstFold(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                in_stack_fffffffffffffef8), bVar1)) {
      if (local_58 < 0) {
        uVar2 = __cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        Exception::Exception
                  ((Exception *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   in_stack_ffffffffffffff10);
        __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
      }
    }
    else {
      Output::println(in_RSI,"// check for negative sizes");
      pOVar6 = in_RSI;
      uVar2 = std::__cxx11::string::c_str();
      Output::println(in_RSI,"if ( %s < 0 )",uVar2);
      in_RSI = pOVar6;
      pcVar3 = Object::Location((Object *)0x14b780);
      uVar2 = std::__cxx11::string::c_str();
      Output::println(pOVar6,"throw binpac::ExceptionInvalidStringLength(\"%s\", %s);",pcVar3,uVar2)
      ;
    }
    pOVar6 = in_RSI;
    Type::value_var(in_RDI);
    pcVar3 = Env::LValue(in_stack_fffffffffffffef0,(ID *)in_stack_fffffffffffffee8);
    pcVar4 = DataPtr::ptr_expr((DataPtr *)0x14b804);
    uVar2 = std::__cxx11::string::c_str();
    Output::println(in_RSI,"%s.init(%s, %s);",pcVar3,pcVar4,uVar2);
  }
  pIVar5 = Type::parsing_complete_var(in_stack_fffffffffffffee8);
  if (pIVar5 != (ID *)0x0) {
    Type::parsing_complete_var(in_stack_fffffffffffffee8);
    pcVar3 = Env::LValue(in_stack_fffffffffffffef0,(ID *)in_stack_fffffffffffffee8);
    Output::println(pOVar6,"%s = true;",pcVar3);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void StringType::DoGenParseCode(Output* out_cc, Env* env, const DataPtr& data, int flags)
	{
	string str_size = GenStringSize(out_cc, env, data);

	// Generate additional checking
	switch ( type_ )
		{
		case CSTR:
			GenCheckingCStr(out_cc, env, data, str_size);
			break;
		case REGEX:
		case ANYSTR:
			break;
		}

	if ( ! anonymous_value_var() )
		{
		// Set the value variable

		int len;

		if ( type_ == ANYSTR && attr_length_expr_ && attr_length_expr_->ConstFold(env, &len) )
			{
			// can check for a negative length now
			if ( len < 0 )
				throw Exception(this, "negative &length on string");
			}
		else
			{
			out_cc->println("// check for negative sizes");
			out_cc->println("if ( %s < 0 )", str_size.c_str());
			out_cc->println("throw binpac::ExceptionInvalidStringLength(\"%s\", %s);", Location(),
			                str_size.c_str());
			}

		out_cc->println("%s.init(%s, %s);", env->LValue(value_var()), data.ptr_expr(),
		                str_size.c_str());
		}

	if ( parsing_complete_var() )
		{
		out_cc->println("%s = true;", env->LValue(parsing_complete_var()));
		}
	}